

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleighbase.cc
# Opt level: O0

VarnodeData * __thiscall SleighBase::getRegister(SleighBase *this,string *nm)

{
  int iVar1;
  SleighError *pSVar2;
  VarnodeData *pVVar3;
  string local_70 [35];
  undefined1 local_4d;
  string local_40 [32];
  VarnodeSymbol *local_20;
  VarnodeSymbol *sym;
  string *nm_local;
  SleighBase *this_local;
  
  sym = (VarnodeSymbol *)nm;
  nm_local = (string *)this;
  local_20 = (VarnodeSymbol *)findSymbol(this,nm);
  if (local_20 == (VarnodeSymbol *)0x0) {
    local_4d = 1;
    pSVar2 = (SleighError *)__cxa_allocate_exception(0x20);
    std::operator+((char *)local_40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Unknown register name: ");
    SleighError::SleighError(pSVar2,local_40);
    local_4d = 0;
    __cxa_throw(pSVar2,&SleighError::typeinfo,SleighError::~SleighError);
  }
  iVar1 = (*(local_20->super_PatternlessSymbol).super_SpecificSymbol.super_TripleSymbol.
            super_SleighSymbol._vptr_SleighSymbol[2])();
  if (iVar1 != 6) {
    pSVar2 = (SleighError *)__cxa_allocate_exception(0x20);
    std::operator+((char *)local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Symbol is not a register: ");
    SleighError::SleighError(pSVar2,local_70);
    __cxa_throw(pSVar2,&SleighError::typeinfo,SleighError::~SleighError);
  }
  pVVar3 = VarnodeSymbol::getFixedVarnode(local_20);
  return pVVar3;
}

Assistant:

const VarnodeData &SleighBase::getRegister(const string &nm) const

{
  VarnodeSymbol *sym = (VarnodeSymbol *)findSymbol(nm);
  if (sym == (VarnodeSymbol *)0)
    throw SleighError("Unknown register name: "+nm);
  if (sym->getType() != SleighSymbol::varnode_symbol)
    throw SleighError("Symbol is not a register: "+nm);
  return sym->getFixedVarnode();
}